

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O2

OPJ_BOOL opj_t2_encode_packets
                   (opj_t2_t *p_t2,OPJ_UINT32 p_tile_no,opj_tcd_tile_t *p_tile,
                   OPJ_UINT32 p_maxlayers,OPJ_BYTE *p_dest,OPJ_UINT32 *p_data_written,
                   OPJ_UINT32 p_max_len,opj_codestream_info_t *cstr_info,
                   opj_tcd_marker_info_t *p_marker_info,OPJ_UINT32 p_tp_num,OPJ_INT32 p_tp_pos,
                   OPJ_UINT32 p_pino,J2K_T2_MODE p_t2_mode,opj_event_mgr_t *p_manager)

{
  OPJ_UINT16 OVar1;
  int iVar2;
  uint uVar3;
  opj_image_t *p_image;
  ulong uVar4;
  OPJ_UINT32 OVar5;
  OPJ_BOOL OVar6;
  opj_pi_iterator_t *poVar7;
  OPJ_UINT32 *pOVar8;
  opj_packet_info_t *poVar9;
  long lVar10;
  opj_cp_t *cp;
  opj_pi_iterator_t *p_pi;
  opj_pi_iterator_t *pi;
  OPJ_UINT32 pino;
  OPJ_BYTE *pOVar11;
  OPJ_UINT32 length;
  OPJ_BOOL local_88;
  OPJ_UINT32 local_84;
  opj_pi_iterator_t *local_80;
  ulong local_78;
  opj_cp_t *local_70;
  OPJ_BYTE *local_68;
  OPJ_UINT32 local_5c;
  opj_tcp_t *local_58;
  ulong local_50;
  opj_tcd_tile_t *local_48;
  OPJ_UINT32 *local_40;
  OPJ_UINT32 local_34;
  
  p_image = p_t2->image;
  local_70 = p_t2->cp;
  local_50 = (ulong)p_tile_no;
  local_58 = local_70->tcps + local_50;
  OVar1 = local_70->rsiz;
  if ((local_70->m_specific_param).m_dec.m_reduce == 0) {
    local_5c = 1;
  }
  else {
    local_5c = p_image->numcomps;
  }
  OVar5 = local_58->numpocs;
  local_68 = p_dest;
  local_48 = p_tile;
  local_40 = p_data_written;
  poVar7 = opj_pi_initialise_encode(p_image,local_70,p_tile_no,p_t2_mode,p_manager);
  pOVar11 = local_68;
  if (poVar7 == (opj_pi_iterator_t *)0x0) {
    return 0;
  }
  local_78 = (ulong)p_max_len;
  *local_40 = 0;
  local_80 = poVar7;
  local_34 = OVar5;
  if (p_t2_mode == THRESH_CALC) {
    local_50 = CONCAT44(local_50._4_4_,(OVar1 == 4) + 1);
    cp = local_70;
    for (OVar5 = 0; OVar5 != local_5c; OVar5 = OVar5 + 1) {
      local_68 = (OPJ_BYTE *)((ulong)local_68 & 0xffffffff00000000);
      pi = poVar7;
      for (pino = 0; pino != (OPJ_UINT32)local_50; pino = pino + 1) {
        opj_pi_create_encode(poVar7,cp,p_tile_no,pino,OVar5,p_tp_pos,THRESH_CALC);
        local_88 = 0;
        p_pi = local_80;
        if ((pi->poc).prg == OPJ_PROG_UNKNOWN) goto LAB_0013a47f;
        while (OVar6 = opj_pi_next(pi), OVar6 != 0) {
          if (pi->layno < p_maxlayers) {
            local_84 = 0;
            length = (OPJ_UINT32)local_78;
            OVar6 = opj_t2_encode_packet
                              (p_tile_no,local_48,local_58,pi,pOVar11,&local_84,length,cstr_info,
                               THRESH_CALC,p_manager);
            p_pi = local_80;
            if (OVar6 == 0) goto LAB_0013a47f;
            local_68 = (OPJ_BYTE *)CONCAT44(local_68._4_4_,(uint)local_68 + local_84);
            pOVar11 = pOVar11 + local_84;
            local_78 = (ulong)(length - local_84);
            *local_40 = *local_40 + local_84;
          }
        }
        uVar3 = (local_70->m_specific_param).m_dec.m_reduce;
        p_pi = local_80;
        if (uVar3 != 0 && uVar3 < (uint)local_68) goto LAB_0013a47f;
        pi = pi + 1;
        cp = local_70;
        poVar7 = local_80;
      }
    }
    local_88 = 1;
    p_pi = poVar7;
  }
  else {
    opj_pi_create_encode(poVar7,local_70,p_tile_no,p_pino,p_tp_num,p_tp_pos,p_t2_mode);
    if (local_80[p_pino].poc.prg == OPJ_PROG_UNKNOWN) {
      local_88 = 0;
      p_pi = local_80;
    }
    else {
      local_88 = 0;
      if ((p_marker_info != (opj_tcd_marker_info_t *)0x0) && (p_marker_info->need_PLT != 0)) {
        if (p_marker_info->packet_count != 0) {
          __assert_fail("p_marker_info->packet_count == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/t2.c"
                        ,0x13d,
                        "OPJ_BOOL opj_t2_encode_packets(opj_t2_t *, OPJ_UINT32, opj_tcd_tile_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, opj_codestream_info_t *, opj_tcd_marker_info_t *, OPJ_UINT32, OPJ_INT32, OPJ_UINT32, J2K_T2_MODE, opj_event_mgr_t *)"
                       );
        }
        if (p_marker_info->p_packet_size != (OPJ_UINT32 *)0x0) {
          __assert_fail("p_marker_info->p_packet_size == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/t2.c"
                        ,0x13e,
                        "OPJ_BOOL opj_t2_encode_packets(opj_t2_t *, OPJ_UINT32, opj_tcd_tile_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, opj_codestream_info_t *, opj_tcd_marker_info_t *, OPJ_UINT32, OPJ_INT32, OPJ_UINT32, J2K_T2_MODE, opj_event_mgr_t *)"
                       );
        }
        OVar5 = opj_get_encoding_packet_count(p_image,local_70,p_tile_no);
        pOVar8 = (OPJ_UINT32 *)opj_malloc((ulong)OVar5 << 2);
        p_marker_info->p_packet_size = pOVar8;
        p_pi = local_80;
        if (pOVar8 == (OPJ_UINT32 *)0x0) goto LAB_0013a47f;
      }
      uVar4 = local_50;
      poVar7 = poVar7 + p_pino;
      while (OVar6 = opj_pi_next(poVar7), OVar6 != 0) {
        if (poVar7->layno < p_maxlayers) {
          local_84 = 0;
          OVar6 = opj_t2_encode_packet
                            (p_tile_no,local_48,local_58,poVar7,pOVar11,&local_84,
                             (OPJ_UINT32)local_78,cstr_info,p_t2_mode,p_manager);
          p_pi = local_80;
          if (OVar6 == 0) goto LAB_0013a47f;
          *local_40 = *local_40 + local_84;
          if ((p_marker_info != (opj_tcd_marker_info_t *)0x0) && (p_marker_info->need_PLT != 0)) {
            p_marker_info->p_packet_size[p_marker_info->packet_count] = local_84;
            p_marker_info->packet_count = p_marker_info->packet_count + 1;
          }
          if (cstr_info != (opj_codestream_info_t *)0x0) {
            iVar2 = cstr_info->packno;
            if (cstr_info->index_write != 0) {
              poVar9 = cstr_info->tile[uVar4].packet + iVar2;
              if (iVar2 == 0) {
                lVar10 = (long)cstr_info->tile[uVar4].end_header;
LAB_0013a30a:
                lVar10 = lVar10 + 1;
              }
              else if (((((byte)local_58->field_0x1638 >> 2 |
                         *(byte *)((long)&local_70->m_specific_param + 0x18)) & 1) == 0) ||
                      (lVar10 = poVar9->start_pos, lVar10 == 0)) {
                lVar10 = poVar9[-1].end_pos;
                goto LAB_0013a30a;
              }
              poVar9->start_pos = lVar10;
              poVar9->end_pos = (ulong)local_84 + lVar10 + -1;
              poVar9->end_ph_pos = lVar10 + poVar9->end_ph_pos + -1;
            }
            cstr_info->packno = iVar2 + 1;
          }
          pOVar11 = pOVar11 + local_84;
          local_78 = (ulong)((int)local_78 - local_84);
          local_48->packno = local_48->packno + 1;
        }
      }
      local_88 = 1;
      p_pi = local_80;
    }
  }
LAB_0013a47f:
  opj_pi_destroy(p_pi,local_34 + 1);
  return local_88;
}

Assistant:

OPJ_BOOL opj_t2_encode_packets(opj_t2_t* p_t2,
                               OPJ_UINT32 p_tile_no,
                               opj_tcd_tile_t *p_tile,
                               OPJ_UINT32 p_maxlayers,
                               OPJ_BYTE *p_dest,
                               OPJ_UINT32 * p_data_written,
                               OPJ_UINT32 p_max_len,
                               opj_codestream_info_t *cstr_info,
                               opj_tcd_marker_info_t* p_marker_info,
                               OPJ_UINT32 p_tp_num,
                               OPJ_INT32 p_tp_pos,
                               OPJ_UINT32 p_pino,
                               J2K_T2_MODE p_t2_mode,
                               opj_event_mgr_t *p_manager)
{
    OPJ_BYTE *l_current_data = p_dest;
    OPJ_UINT32 l_nb_bytes = 0;
    OPJ_UINT32 compno;
    OPJ_UINT32 poc;
    opj_pi_iterator_t *l_pi = 00;
    opj_pi_iterator_t *l_current_pi = 00;
    opj_image_t *l_image = p_t2->image;
    opj_cp_t *l_cp = p_t2->cp;
    opj_tcp_t *l_tcp = &l_cp->tcps[p_tile_no];
    OPJ_UINT32 pocno = (l_cp->rsiz == OPJ_PROFILE_CINEMA_4K) ? 2 : 1;
    OPJ_UINT32 l_max_comp = l_cp->m_specific_param.m_enc.m_max_comp_size > 0 ?
                            l_image->numcomps : 1;
    OPJ_UINT32 l_nb_pocs = l_tcp->numpocs + 1;

    l_pi = opj_pi_initialise_encode(l_image, l_cp, p_tile_no, p_t2_mode, p_manager);
    if (!l_pi) {
        return OPJ_FALSE;
    }

    * p_data_written = 0;

    if (p_t2_mode == THRESH_CALC) { /* Calculating threshold */
        l_current_pi = l_pi;

        for (compno = 0; compno < l_max_comp; ++compno) {
            OPJ_UINT32 l_comp_len = 0;
            l_current_pi = l_pi;

            for (poc = 0; poc < pocno ; ++poc) {
                OPJ_UINT32 l_tp_num = compno;

                /* TODO MSD : check why this function cannot fail (cf. v1) */
                opj_pi_create_encode(l_pi, l_cp, p_tile_no, poc, l_tp_num, p_tp_pos, p_t2_mode);

                if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
                    /* TODO ADE : add an error */
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    return OPJ_FALSE;
                }
                while (opj_pi_next(l_current_pi)) {
                    if (l_current_pi->layno < p_maxlayers) {
                        l_nb_bytes = 0;

                        if (! opj_t2_encode_packet(p_tile_no, p_tile, l_tcp, l_current_pi,
                                                   l_current_data, &l_nb_bytes,
                                                   p_max_len, cstr_info,
                                                   p_t2_mode,
                                                   p_manager)) {
                            opj_pi_destroy(l_pi, l_nb_pocs);
                            return OPJ_FALSE;
                        }

                        l_comp_len += l_nb_bytes;
                        l_current_data += l_nb_bytes;
                        p_max_len -= l_nb_bytes;

                        * p_data_written += l_nb_bytes;
                    }
                }

                if (l_cp->m_specific_param.m_enc.m_max_comp_size) {
                    if (l_comp_len > l_cp->m_specific_param.m_enc.m_max_comp_size) {
                        opj_pi_destroy(l_pi, l_nb_pocs);
                        return OPJ_FALSE;
                    }
                }

                ++l_current_pi;
            }
        }
    } else { /* t2_mode == FINAL_PASS  */
        opj_pi_create_encode(l_pi, l_cp, p_tile_no, p_pino, p_tp_num, p_tp_pos,
                             p_t2_mode);

        l_current_pi = &l_pi[p_pino];
        if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
            /* TODO ADE : add an error */
            opj_pi_destroy(l_pi, l_nb_pocs);
            return OPJ_FALSE;
        }

        if (p_marker_info && p_marker_info->need_PLT) {
            /* One time use intended */
            assert(p_marker_info->packet_count == 0);
            assert(p_marker_info->p_packet_size == NULL);

            p_marker_info->p_packet_size = (OPJ_UINT32*) opj_malloc(
                                               opj_get_encoding_packet_count(l_image, l_cp, p_tile_no) * sizeof(OPJ_UINT32));
            if (p_marker_info->p_packet_size == NULL) {
                opj_pi_destroy(l_pi, l_nb_pocs);
                return OPJ_FALSE;
            }
        }

        while (opj_pi_next(l_current_pi)) {
            if (l_current_pi->layno < p_maxlayers) {
                l_nb_bytes = 0;

                if (! opj_t2_encode_packet(p_tile_no, p_tile, l_tcp, l_current_pi,
                                           l_current_data, &l_nb_bytes, p_max_len,
                                           cstr_info, p_t2_mode, p_manager)) {
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    return OPJ_FALSE;
                }

                l_current_data += l_nb_bytes;
                p_max_len -= l_nb_bytes;

                * p_data_written += l_nb_bytes;

                if (p_marker_info && p_marker_info->need_PLT) {
                    p_marker_info->p_packet_size[p_marker_info->packet_count] = l_nb_bytes;
                    p_marker_info->packet_count ++;
                }

                /* INDEX >> */
                if (cstr_info) {
                    if (cstr_info->index_write) {
                        opj_tile_info_t *info_TL = &cstr_info->tile[p_tile_no];
                        opj_packet_info_t *info_PK = &info_TL->packet[cstr_info->packno];
                        if (!cstr_info->packno) {
                            info_PK->start_pos = info_TL->end_header + 1;
                        } else {
                            info_PK->start_pos = ((l_cp->m_specific_param.m_enc.m_tp_on | l_tcp->POC) &&
                                                  info_PK->start_pos) ? info_PK->start_pos : info_TL->packet[cstr_info->packno -
                                                                            1].end_pos + 1;
                        }
                        info_PK->end_pos = info_PK->start_pos + l_nb_bytes - 1;
                        info_PK->end_ph_pos += info_PK->start_pos -
                                               1;  /* End of packet header which now only represents the distance
                                                                                                                                                                                                                                                   to start of packet is incremented by value of start of packet*/
                    }

                    cstr_info->packno++;
                }
                /* << INDEX */
                ++p_tile->packno;
            }
        }
    }

    opj_pi_destroy(l_pi, l_nb_pocs);

    return OPJ_TRUE;
}